

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

void __thiscall
Js::JSONStringifier::ReadObjectElement
          (JSONStringifier *this,JavascriptString *propertyName,PropertyRecord *propertyRecord,
          RecyclableObject *obj,JSONObject *jsonObject,JSONObjectStack *objectStack)

{
  Var value;
  undefined1 auStack_68 [8];
  JSONObjectProperty prop;
  
  prop.propertyValue.type = Array;
  prop.propertyValue._1_7_ = 0;
  prop.propertyValue.field_1.numericValue.value.ptr = (Type)(void *)0x0;
  auStack_68 = (undefined1  [8])0x0;
  prop.propertyName.ptr = (JavascriptString *)0x0;
  Memory::Recycler::WBSetBit((char *)auStack_68);
  auStack_68 = (undefined1  [8])propertyName;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((JSONObjectProperty *)auStack_68);
  value = ReadValue(this,propertyName,propertyRecord,obj);
  ReadProperty(this,propertyName,obj,(JSONProperty *)&prop,value,objectStack);
  AppendObjectElement(this,propertyName,jsonObject,(JSONObjectProperty *)auStack_68);
  return;
}

Assistant:

void
JSONStringifier::ReadObjectElement(
    _In_ JavascriptString* propertyName,
    _In_opt_ PropertyRecord const* propertyRecord,
    _In_ RecyclableObject* obj,
    _In_ JSONObject* jsonObject,
    _In_ JSONObjectStack* objectStack)
{
    JSONObjectProperty prop;
    prop.propertyName = propertyName;

    Var value = this->ReadValue(propertyName, propertyRecord, obj);

    this->ReadProperty(propertyName, obj, &prop.propertyValue, value, objectStack);

    this->AppendObjectElement(propertyName, jsonObject, &prop);
}